

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O1

void dump_symbol_table(SymbolTable *s)

{
  Bucket *pBVar1;
  Bucket *pBVar2;
  int iVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  SymbolInfo *pSVar7;
  
  uVar5 = 0;
  uVar6 = 0;
  do {
    pBVar1 = s->bucket[uVar5];
    if (0 < pBVar1->num_symbols) {
      printf("Bucket #%d:\n---------------\n",uVar5 & 0xffffffff);
      iVar3 = pBVar1->num_symbols;
      if (0 < iVar3) {
        lVar4 = 0;
        pBVar2 = pBVar1;
        do {
          pSVar7 = &pBVar2->symbol[0].value;
          printf("\t\"%s\"\t:\t%ld\n",pBVar2->symbol[0].name,pSVar7->n);
          lVar4 = lVar4 + 1;
          iVar3 = pBVar1->num_symbols;
          pBVar2 = (Bucket *)pSVar7;
        } while (lVar4 < iVar3);
      }
      uVar6 = (ulong)(((int)uVar6 + iVar3) - 1);
    }
    uVar5 = uVar5 + 1;
  } while (uVar5 != 0xfd);
  printf("Total collisions: %d\n",uVar6);
  return;
}

Assistant:

void
dump_symbol_table (const SymbolTable *s)
{
  const Bucket *b;
  int i, j, collisions;

  for (i = collisions = 0; i < HASH_BUCKETS; i++)
    {
      b = s->bucket[i];
      if (b->num_symbols > 0)
	{
	  printf ("Bucket #%d:\n---------------\n", i);
	  for (j = 0; j < b->num_symbols; j++)
	    printf ("\t\"%s\"\t:\t%ld\n", b->symbol[j].name,
		    b->symbol[j].value.n);
	  collisions += b->num_symbols - 1;
	}
    }

  printf ("Total collisions: %d\n", collisions);
}